

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

error_code
llvm::sys::fs::createTemporaryFile
          (Twine *Model,int *ResultFD,SmallVectorImpl<char> *ResultPath,FSEntity Type)

{
  perms Mode;
  char *__s;
  size_type sVar1;
  iterator Str;
  error_code eVar2;
  Twine local_110;
  StringRef local_f8;
  undefined1 local_e8 [8];
  StringRef P;
  SmallString<128U> Storage;
  FSEntity Type_local;
  SmallVectorImpl<char> *ResultPath_local;
  int *ResultFD_local;
  Twine *Model_local;
  
  SmallString<128U>::SmallString((SmallString<128U> *)&P.Length);
  _local_e8 = Twine::toNullTerminatedStringRef(Model,(SmallVectorImpl<char> *)&P.Length);
  __s = anon_unknown.dwarf_112e1e::separators(native);
  local_f8.Data = __s;
  if (__s != (char *)0x0) {
    strlen(__s);
  }
  sVar1 = StringRef::find_first_of((StringRef *)local_e8,local_f8,0);
  if (sVar1 == 0xffffffffffffffff) {
    Str = StringRef::begin((StringRef *)local_e8);
    Twine::Twine(&local_110,Str);
    Mode = operator|(owner_read,owner_write);
    eVar2 = createUniqueEntity(&local_110,ResultFD,ResultPath,true,Mode,Type,F_None);
    SmallString<128U>::~SmallString((SmallString<128U> *)&P.Length);
    eVar2._4_4_ = 0;
    return eVar2;
  }
  __assert_fail("P.find_first_of(separators(Style::native)) == StringRef::npos && \"Model must be a simple filename.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Path.cpp"
                ,0x314,
                "std::error_code llvm::sys::fs::createTemporaryFile(const Twine &, int &, llvm::SmallVectorImpl<char> &, FSEntity)"
               );
}

Assistant:

static std::error_code
createTemporaryFile(const Twine &Model, int &ResultFD,
                    llvm::SmallVectorImpl<char> &ResultPath, FSEntity Type) {
  SmallString<128> Storage;
  StringRef P = Model.toNullTerminatedStringRef(Storage);
  assert(P.find_first_of(separators(Style::native)) == StringRef::npos &&
         "Model must be a simple filename.");
  // Use P.begin() so that createUniqueEntity doesn't need to recreate Storage.
  return createUniqueEntity(P.begin(), ResultFD, ResultPath, true,
                            owner_read | owner_write, Type);
}